

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O1

void anm_replace(anm_archive_t *anm,FILE *anmfp,anm_entry_t *entry_first,char *filename,int version)

{
  ushort uVar1;
  ushort uVar2;
  anm_entry_t *paVar3;
  uchar *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uchar *puVar13;
  thtx_header_t *ptVar14;
  anm_entry_t *paVar15;
  image_t *image;
  uint uVar16;
  uint uVar17;
  format_t format;
  long lVar18;
  list_node_t *plVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  bool bVar25;
  uint32_t local_b4;
  size_t size;
  image_t image2;
  uint height;
  uint width;
  
  width = 0;
  height = 0;
  util_total_entry_size(entry_first,&width,&height);
  uVar6 = width;
  uVar22 = height;
  uVar12 = (ulong)width;
  uVar24 = (ulong)height;
  if (height != 0 && width != 0) {
    if (version == 0x13) {
      if (option_dont_add_offset_border == 0) {
        bVar25 = entry_first->header->x != 0;
        image = (image_t *)CONCAT71((int7)((ulong)&width >> 8),entry_first->header->y != 0);
      }
      else {
        bVar25 = false;
        image = (image_t *)0x0;
      }
      if ((((entry_first->thtx->size < 0x1c) || (*(long *)entry_first->data != 0xa1a0a0d474e5089))
          || (*(int *)((long)entry_first->data + 0xc) != 0x52444849)) ||
         ((!bVar25 && (char)image == '\0' && (entry_first->next_by_name == (anm_entry_t *)0x0)))) {
        if (1 < option_verbose) {
          anm_replace_cold_1();
        }
        if ((bVar25 || (char)image != '\0') ||
           ((paVar15 = entry_first->next_by_name, paVar15 != (anm_entry_t *)0x0 &&
            (((paVar15->next_by_name != (anm_entry_t *)0x0 ||
              (uVar17 = entry_first->thtx->size, uVar17 != paVar15->thtx->size)) ||
             (iVar7 = bcmp(entry_first->data,paVar15->data,(ulong)uVar17), iVar7 != 0)))))) {
          anm_replace_cold_2();
        }
        bVar25 = false;
        bVar5 = false;
      }
      else {
        if (1 < option_verbose) {
          anm_replace_cold_3();
        }
        image = (image_t *)malloc(0x18);
        png_read_mem(image,entry_first->data,(ulong)entry_first->thtx->size);
        bVar5 = true;
        bVar25 = true;
      }
      if (!bVar5) {
        return;
      }
    }
    else {
      image = png_read(filename);
      bVar25 = false;
    }
    uVar20 = (ulong)image->width;
    if ((image->width < uVar6) || (image->height < uVar22)) {
LAB_0010f926:
      fprintf(_stderr,"%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",argv0,
              current_input,entry_first->name,filename,uVar20,(ulong)image->height,uVar12,uVar24);
LAB_0010f970:
      exit(1);
    }
    uVar22 = uVar22 * uVar6;
    uVar24 = (ulong)uVar22;
    lVar21 = 0;
    do {
      lVar18 = 0;
      paVar15 = entry_first;
      plVar19 = (list_node_t *)&anm->entries;
      while (plVar19 = plVar19->next, plVar19 != (list_node_t *)0x0) {
        paVar3 = (anm_entry_t *)plVar19->data;
        if (paVar3 == paVar15) {
          ptVar14 = paVar3->thtx;
          format = (&DAT_0013a420)[lVar21];
          if ((format == ptVar14->format) && (paVar3->header->hasdata != 0)) {
            if (bVar25) {
              if (lVar21 != 1) {
                anm_replace_cold_4();
                filename = (char *)anmfp;
                goto LAB_0010f926;
              }
              ptVar14->size = (uint)ptVar14->h * (uint)ptVar14->w * 4;
              free(paVar3->data);
              puVar13 = (uchar *)malloc((ulong)paVar3->thtx->size);
              paVar3->data = puVar13;
              format = 0xffffffff;
            }
            puVar13 = format_from_rgba((uint32_t *)image->data,uVar22,format);
            uVar17 = 0;
            local_b4 = 0;
            if (option_dont_add_offset_border == 0) {
              local_b4 = paVar3->header->x;
              uVar17 = paVar3->header->y;
            }
            ptVar14 = paVar3->thtx;
            uVar16 = ptVar14->h + uVar17;
            if (anmfp == (FILE *)0x0) {
              if (uVar17 < uVar16) {
                iVar23 = uVar6 * uVar17;
                iVar7 = 0;
                do {
                  puVar4 = paVar3->data;
                  uVar1 = ptVar14->w;
                  uVar16 = format_Bpp(format);
                  uVar8 = format_Bpp(format);
                  uVar10 = format_Bpp(format);
                  uVar2 = paVar3->thtx->w;
                  uVar11 = format_Bpp(format);
                  memcpy(puVar4 + (uint)uVar1 * uVar16 * iVar7,
                         puVar13 + (ulong)(uVar10 * local_b4) + (ulong)(uVar8 * iVar23),
                         (ulong)(uVar2 * uVar11));
                  ptVar14 = paVar3->thtx;
                  iVar9 = uVar17 + iVar7;
                  iVar7 = iVar7 + 1;
                  iVar23 = iVar23 + uVar6;
                } while (iVar9 + 1U < ptVar14->h + uVar17);
              }
            }
            else if (uVar17 < uVar16) {
              iVar23 = uVar6 * uVar17;
              iVar7 = 0;
              do {
                uVar16 = paVar3->header->thtxoffset;
                uVar1 = ptVar14->w;
                uVar8 = format_Bpp(format);
                iVar9 = file_seek(anmfp,(ulong)((uint)uVar1 * uVar8 * iVar7) + lVar18 + 0x10 +
                                        (ulong)uVar16);
                if (iVar9 == 0) goto LAB_0010f970;
                uVar16 = format_Bpp(format);
                uVar8 = format_Bpp(format);
                uVar1 = paVar3->thtx->w;
                uVar10 = format_Bpp(format);
                iVar9 = file_write(anmfp,puVar13 + (ulong)(uVar8 * local_b4) +
                                                   (ulong)(uVar16 * iVar23),(ulong)(uVar1 * uVar10))
                ;
                if (iVar9 == 0) goto LAB_0010f970;
                ptVar14 = paVar3->thtx;
                iVar9 = uVar17 + iVar7;
                iVar7 = iVar7 + 1;
                iVar23 = iVar23 + uVar6;
              } while (iVar9 + 1U < ptVar14->h + uVar17);
            }
            free(puVar13);
            if (bVar25) {
              image2.data = paVar3->data;
              image2.width = (uint)paVar3->thtx->w;
              image2.height = (uint)paVar3->thtx->h;
              image2.format = 0xffffffff;
              puVar13 = (uchar *)png_write_mem(&image2,&size);
              paVar3->data = puVar13;
              paVar3->thtx->size = (uint32_t)size;
              free(image2.data);
            }
            paVar3->processed = 1;
          }
          paVar15 = paVar3->next_by_name;
        }
        lVar18 = lVar18 + (ulong)paVar3->header->nextoffset;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 5);
    free(image->data);
    free(image);
  }
  return;
}

Assistant:

static void
anm_replace(
    anm_archive_t* anm,
    FILE* anmfp,
    anm_entry_t* entry_first,
    const char* filename,
    int version)
{
    const format_t formats[] = {
        FORMAT_RGBA8888,
        FORMAT_BGRA8888,
        FORMAT_RGB565,
        FORMAT_ARGB4444,
        FORMAT_GRAY8
    };
    unsigned int f;
    unsigned int width = 0;
    unsigned int height = 0;
    image_t* image;

    util_total_entry_size(entry_first, &width, &height);
    if (width == 0 || height == 0) {
        /* There's nothing to do. */
        return;
    }

    int is_png = 0;
    /* NEWHU: 19 */
    if (version == 19) {
        anm_entry_t *entry = entry_first;
        const uint32_t ox = option_dont_add_offset_border ? 0 : entry->header->x;
        const uint32_t oy = option_dont_add_offset_border ? 0 : entry->header->y;
        if (!(png_identify(entry->data, entry->thtx->size) && (ox || oy || entry->next_by_name))) {
            if (option_verbose >= 2)
                fprintf(stderr, "%s: not composing %s\n", argv0, filename);
            /* TH19's ability/dummy.png is used twice, but it's the same texture.
             * Avoid printing a warning in this particular case. */
            if (ox || oy || entry->next_by_name && (entry->next_by_name->next_by_name ||
                    entry->thtx->size != entry->next_by_name->thtx->size ||
                    memcmp(entry->data, entry->next_by_name->data, entry->thtx->size))) {
                fprintf(stderr, "%s: warning: %s can't be composed because it's a JPEG\n", argv0, filename);
            }
            return;
        }
        if (option_verbose >= 2)
            fprintf(stderr, "%s: composing %s\n", argv0, filename);
        image = malloc(sizeof(image_t));
        png_read_mem(image, entry->data, entry->thtx->size);
        is_png = 1;
    } else {
        image = png_read(filename);
    }

    if (width > image->width || height > image->height) {
        fprintf(stderr,
            "%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",
            argv0, current_input, entry_first->name, filename, image->width, image->height,
            width, height);
        exit(1);
    }

    for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {
        long offset = 0;
        anm_entry_t *entry, *entry_next = entry_first;
        list_for_each(&anm->entries, entry) {
            if (entry == entry_next &&
                entry->thtx->format == formats[f] &&
                entry->header->hasdata) {
                unsigned int y;
                format_t fmt = formats[f];

                if (is_png) {
                    if (fmt != FORMAT_BGRA8888) {
                        fprintf(stderr, "%s: %s is not FORMAT_BGRA8888\n", argv0, entry->name);
                        exit(1);
                    }
                    fmt = FORMAT_RGBA8888;
                    entry->thtx->size = entry->thtx->w*entry->thtx->h*4;
                    free(entry->data);
                    entry->data = malloc(entry->thtx->size);
                }

                unsigned char* converted_data = format_from_rgba((uint32_t*)image->data, width * height, fmt);
                const uint32_t ox = option_dont_add_offset_border ? 0 : entry->header->x;
                const uint32_t oy = option_dont_add_offset_border ? 0 : entry->header->y;

                if (anmfp) {
                    for (y = oy; y < oy + entry->thtx->h; ++y) {
                        if (!file_seek(anmfp,
                            offset + entry->header->thtxoffset + sizeof(thtx_header_t) + (y - oy) * entry->thtx->w * format_Bpp(fmt)))
                            exit(1);
                        if (!file_write(anmfp, converted_data + y * width * format_Bpp(fmt) + ox * format_Bpp(fmt), entry->thtx->w * format_Bpp(fmt)))
                            exit(1);
                    }
                } else {
                    for (y = oy; y < oy + entry->thtx->h; ++y) {
                        memcpy(entry->data + (y - oy) * entry->thtx->w * format_Bpp(fmt),
                               converted_data + y * width * format_Bpp(fmt) + ox * format_Bpp(fmt),
                               entry->thtx->w * format_Bpp(fmt));
                    }
                }

                free(converted_data);

                if (is_png) {
                    image_t image2 = {
                        .data = entry->data,
                        .width = entry->thtx->w,
                        .height = entry->thtx->h,
                        .format = FORMAT_RGBA8888,
                    };
                    size_t size;
                    entry->data = png_write_mem(&image2, &size);
                    entry->thtx->size = size;
                    free(image2.data);
                }

                entry->processed = 1;
            }
            if (entry == entry_next)
                entry_next = entry->next_by_name;

            offset += entry->header->nextoffset;
        }
    }

    free(image->data);
    free(image);
}